

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O3

int __thiscall
soul::Optimisations::Inliner::clone
          (Inliner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Module *pMVar1;
  Block *trueJump;
  Block *falseJump;
  Expression *cond;
  mapped_type *pmVar2;
  PoolItem *pPVar3;
  
  pMVar1 = this->module;
  cond = cloneExpression(this,*(Expression **)(__fn + 0x18));
  pmVar2 = std::__detail::
           _Map_base<soul::pool_ref<soul::heart::Block>,_std::pair<const_soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Block>_>,_std::hash<soul::pool_ref<soul::heart::Block>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<soul::pool_ref<soul::heart::Block>,_std::pair<const_soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Block>_>,_std::hash<soul::pool_ref<soul::heart::Block>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->remappedBlocks,(key_type *)(__fn + 0x20));
  trueJump = pmVar2->object;
  if (trueJump != (Block *)0x0) {
    pmVar2 = std::__detail::
             _Map_base<soul::pool_ref<soul::heart::Block>,_std::pair<const_soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Block>_>,_std::hash<soul::pool_ref<soul::heart::Block>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<soul::pool_ref<soul::heart::Block>,_std::pair<const_soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Block>,_soul::pool_ptr<soul::heart::Block>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Block>_>,_std::hash<soul::pool_ref<soul::heart::Block>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->remappedBlocks,(key_type *)(__fn + 0x28));
    falseJump = pmVar2->object;
    if (falseJump != (Block *)0x0) {
      pPVar3 = PoolAllocator::allocateSpaceForObject(&pMVar1->allocator->pool,0xa0);
      heart::BranchIf::BranchIf((BranchIf *)&pPVar3->item,cond,trueJump,falseJump);
      pPVar3->destructor =
           PoolAllocator::
           allocate<soul::heart::BranchIf,_soul::heart::Expression_&,_soul::heart::Block_&,_soul::heart::Block_&>
           ::anon_class_1_0_00000001::__invoke;
      return (int)&pPVar3->item;
    }
  }
  throwInternalCompilerError("object != nullptr","operator*",0x3b);
}

Assistant:

heart::BranchIf& clone (const heart::BranchIf& old)
        {
            return module.allocate<heart::BranchIf> (cloneExpression (old.condition),
                                                     *remappedBlocks[old.targets[0]],
                                                     *remappedBlocks[old.targets[1]]);
        }